

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  _Bool _Var3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  char dirbuffer [1024];
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar5 = (ulong)puVar2[2];
  uVar4 = *puVar2 >> 4;
  uVar1 = uVar4 - 0x2065;
  if (uVar1 < 0xb) {
    uVar5 = 0x481;
    if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
      pcVar6 = "Westmere";
      goto LAB_001044f5;
    }
    uVar5 = 0x120;
    if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
      pcVar6 = "SandyBridge";
      goto LAB_001044f5;
    }
    if (uVar1 != 9) goto LAB_0010421a;
switchD_001043d5_caseD_106a:
    pcVar6 = "Nehalem";
LAB_001044f5:
    printf("x64 processor:  %s\t",pcVar6,uVar5);
    printf(" compiler version: %s\t",
           "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
    putchar(10);
    lVar7 = cpuid(0x80000006);
    if ((char)*(undefined4 *)(lVar7 + 0xc) != '@') {
      lVar7 = cpuid(0x80000006);
      printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar7 + 0xc),
             (ulong)*(uint *)(lVar7 + 8),(ulong)*(uint *)(lVar7 + 0xc));
    }
    memcpy(dirbuffer,
           "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/benchmarks/realdata/"
           ,0x60);
    lVar7 = 0;
    do {
      if (lVar7 == 0x48) {
        return 0;
      }
      strcpy(dirbuffer + 0x5f,*(char **)((long)datadir + lVar7));
      _Var3 = loadAndCheckAll(dirbuffer,false);
      if (!_Var3) break;
      _Var3 = loadAndCheckAll(dirbuffer,true);
      lVar7 = lVar7 + 8;
    } while (_Var3);
    puts("failure");
    return -1;
  }
LAB_0010421a:
  switch(uVar4) {
  case 0x1066:
switchD_001043d5_caseD_1066:
    pcVar6 = "Merom";
    goto LAB_001044f5;
  case 0x1067:
  case 0x106d:
    pcVar6 = "Penryn";
    goto LAB_001044f5;
  case 0x1068:
  case 0x1069:
  case 0x106b:
  case 0x106c:
switchD_001043d5_caseD_1068:
    pcVar6 = "unknown";
    goto LAB_001044f5;
  case 0x106a:
  case 0x106e:
    goto switchD_001043d5_caseD_106a;
  default:
    if (uVar4 - 99 < 2) {
      pcVar6 = "Prescott";
      goto LAB_001044f5;
    }
    if (uVar4 - 0x806c < 2) {
      pcVar6 = "TigerLake";
      goto LAB_001044f5;
    }
    if (uVar4 - 0xa065 < 2) {
      pcVar6 = "Cometlake";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x66) {
      pcVar6 = "Presler";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x6d) {
      pcVar6 = "Dothan";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x6f) goto switchD_001043d5_caseD_1066;
    if (uVar4 == 0x16c) {
      pcVar6 = "Pineview";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x266) {
      pcVar6 = "Lincroft";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x366) {
      pcVar6 = "Cedarview";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x306a) {
      pcVar6 = "IvyBridge";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x306c) {
      pcVar6 = "Haswell";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x306d) {
      pcVar6 = "Broadwell";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x30f1) goto LAB_001043e3;
    if (uVar4 == 0x60f10) {
      pcVar6 = "Zen4";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x506c) {
LAB_00104443:
      pcVar6 = "Goldmont";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x506e) {
      pcVar6 = "Skylake";
      goto LAB_001044f5;
    }
    if (uVar4 == 0x606a) {
LAB_0010444f:
      pcVar6 = "Icelake";
    }
    else {
      if ((uVar4 != 0x60f0) && (uVar4 != 0x60f8)) {
        if (uVar4 == 0x706a) goto LAB_00104443;
        if (uVar4 == 0x706e) goto LAB_0010444f;
        if (uVar4 != 0x70f1) {
          if (uVar4 != 0x806e) {
            if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
              pcVar6 = "Alderlake";
              goto LAB_001044f5;
            }
            if (uVar4 != 0x906e) {
              if (uVar4 != 0x90f0) {
                if (uVar4 == 0xa067) {
                  pcVar6 = "Rocketlake";
                  goto LAB_001044f5;
                }
                if (uVar4 == 0xb067) {
                  pcVar6 = "Raptorlake";
                  goto LAB_001044f5;
                }
                if (uVar4 != 0x20f10) {
                  if (uVar4 == 0x40f40) {
                    pcVar6 = "Zen3+";
                    goto LAB_001044f5;
                  }
                  if (uVar4 != 0x50f00) {
                    if (uVar4 == 0x406c) {
                      pcVar6 = "CherryTrail";
                      goto LAB_001044f5;
                    }
                    goto switchD_001043d5_caseD_1068;
                  }
                }
                pcVar6 = "Zen3";
                goto LAB_001044f5;
              }
              goto LAB_001043e3;
            }
          }
          pcVar6 = "Kabylake";
          goto LAB_001044f5;
        }
      }
LAB_001043e3:
      pcVar6 = "Zen2";
    }
    goto LAB_001044f5;
  }
}

Assistant:

int main() {
    tellmeall();

    char dirbuffer[1024];
    size_t bddl = strlen(BENCHMARK_DATA_DIR);
    strcpy(dirbuffer, BENCHMARK_DATA_DIR);
    for (size_t i = 0; i < sizeof(datadir) / sizeof(const char *); i++) {
        strcpy(dirbuffer + bddl, datadir[i]);
        if (!loadAndCheckAll(dirbuffer, false)) {
            printf("failure\n");
            return -1;
        }
        if (!loadAndCheckAll(dirbuffer, true)) {
            printf("failure\n");
            return -1;
        }
    }

    return EXIT_SUCCESS;
}